

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,double>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  long *plVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  long *plVar5;
  long lVar6;
  data_ptr_t pdVar7;
  bool bVar8;
  idx_t size;
  LogicalType *type;
  Vector *this;
  Vector *pVVar9;
  ulong uVar10;
  idx_t iVar11;
  idx_t iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  Value local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  Vector::ToUnifiedFormat(state_vector,count,&local_b8);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  type = MapType::KeyType(&result->type);
  bVar8 = SupportsOtherBucket(type);
  lVar13 = 0;
  for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
    iVar12 = iVar11;
    if ((local_b8.sel)->sel_vector != (sel_t *)0x0) {
      iVar12 = (idx_t)(local_b8.sel)->sel_vector[iVar11];
    }
    plVar2 = (long *)**(long **)(local_b8.data + iVar12 * 8);
    if (plVar2 != (long *)0x0) {
      lVar13 = (ulong)(*(long *)(*(long *)((*(long **)(local_b8.data + iVar12 * 8))[1] + 8) + -8) !=
                       0 && bVar8) + (plVar2[1] - *plVar2 >> 3) + lVar13;
    }
  }
  ListVector::Reserve(result,lVar13 + size);
  this = MapVector::GetKeys(result);
  pVVar9 = MapVector::GetValues(result);
  pdVar3 = result->data;
  pdVar4 = pVVar9->data;
  for (uVar15 = 0; uVar15 != count; uVar15 = uVar15 + 1) {
    uVar10 = uVar15;
    if ((local_b8.sel)->sel_vector != (sel_t *)0x0) {
      uVar10 = (ulong)(local_b8.sel)->sel_vector[uVar15];
    }
    plVar2 = *(long **)(local_b8.data + uVar10 * 8);
    plVar5 = (long *)*plVar2;
    if (plVar5 == (long *)0x0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar15 + offset);
    }
    else {
      lVar13 = (uVar15 + offset) * 0x10;
      plVar1 = (long *)(pdVar3 + lVar13);
      *(idx_t *)(pdVar3 + lVar13) = size;
      lVar13 = *plVar5;
      lVar6 = plVar5[1];
      pdVar7 = this->data;
      for (lVar14 = 0; lVar6 - lVar13 >> 3 != lVar14; lVar14 = lVar14 + 1) {
        *(undefined8 *)(pdVar7 + lVar14 * 8 + size * 8) = *(undefined8 *)(lVar13 + lVar14 * 8);
        *(undefined8 *)(pdVar4 + lVar14 * 8 + size * 8) =
             *(undefined8 *)(*(long *)plVar2[1] + lVar14 * 8);
      }
      iVar11 = size + lVar14;
      if (bVar8 && *(long *)(*(long *)(plVar2[1] + 8) + -8) != 0) {
        OtherBucketValue(&local_70,&this->type);
        Vector::SetValue(this,iVar11,&local_70);
        Value::~Value(&local_70);
        *(undefined8 *)(pdVar4 + lVar14 * 8 + size * 8) =
             *(undefined8 *)(*(long *)(plVar2[1] + 8) + -8);
        iVar11 = size + lVar14 + 1;
      }
      plVar1[1] = iVar11 - *plVar1;
      size = iVar11;
    }
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_b8);
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}